

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlocksBuilder.h
# Opt level: O2

bool __thiscall
dg::BBlocksBuilder<dg::dda::RWBBlock>::enqueue(BBlocksBuilder<dg::dda::RWBBlock> *this,NodeT *n)

{
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar1;
  NodeT *local_20;
  IDType local_14;
  
  local_14 = (n->super_SubgraphNode<dg::dda::RWNode>).id;
  local_20 = n;
  pVar1 = std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::_M_insert_unique<unsigned_int>(&(this->_processed)._M_t,&local_14);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::deque<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::push_back
              ((deque<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)&this->_queue,
               &local_20);
  }
  return (bool)(pVar1.second & 1);
}

Assistant:

bool enqueue(NodeT *n) {
        // the id 0 is reserved for invalid nodes
        assert(n->getID() != 0 && "Queued invalid node");

        if (!static_cast<bool>(_processed.insert(n->getID()).second))
            return false; // we already queued this node

        _queue.push(n);
        assert(enqueue(n) == false);
        return true;
    }